

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcEmbedTokenList::reduce(CTcEmbedTokenList *this,CTcStrTemplate *tpl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CTcTokenizer *this_00;
  CTcTokenEle *pCVar4;
  undefined8 *in_RSI;
  long *in_RDI;
  CTcTokenEle *dst;
  int trem;
  int rem;
  CTcTokenEle *tele;
  CTcTokenEle *src;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  CTcToken *in_stack_ffffffffffffffd0;
  CTcTokenEle *local_18;
  
  local_18 = (CTcTokenEle *)*in_RDI;
  this_00 = (CTcTokenizer *)*in_RSI;
  iVar3 = (int)in_RDI[2];
  iVar2 = *(int *)(in_RSI + 2);
  while ((local_18 != (CTcTokenEle *)0x0 && this_00 != (CTcTokenizer *)0x0 &&
         (iVar1 = CTcToken::text_matches
                            (in_stack_ffffffffffffffd0,(char *)in_RDI,
                             CONCAT17(local_18 != (CTcTokenEle *)0x0 &&
                                      this_00 != (CTcTokenizer *)0x0,
                                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0))
                            ), iVar1 == 0))) {
    local_18 = CTcTokenEle::getnxt(local_18);
    this_00 = (CTcTokenizer *)CTcTokenEle::getnxt((CTcTokenEle *)this_00);
    iVar3 = iVar3 + -1;
    iVar2 = iVar2 + -1;
  }
  iVar2 = iVar2 + -1;
  iVar3 = iVar3 - iVar2;
  *(int *)(in_RDI + 2) = iVar3;
  if (local_18 != (CTcTokenEle *)*in_RDI) {
    pCVar4 = (CTcTokenEle *)*in_RDI;
    for (; iVar3 != 0 && local_18 != (CTcTokenEle *)0x0; iVar3 = iVar3 + -1) {
      CTcTokenizer::copytok(this_00,(CTcToken *)CONCAT44(iVar3,iVar2),&pCVar4->super_CTcToken);
      local_18 = CTcTokenEle::getnxt(local_18);
      pCVar4 = CTcTokenEle::getnxt(pCVar4);
    }
  }
  in_RDI[1] = *in_RDI;
  for (iVar3 = (int)in_RDI[2]; iVar3 != 0; iVar3 = iVar3 + -1) {
    pCVar4 = CTcTokenEle::getnxt((CTcTokenEle *)in_RDI[1]);
    in_RDI[1] = (long)pCVar4;
  }
  return;
}

Assistant:

void reduce(CTcStrTemplate *tpl)
    {
        /* find the first token in our list matching '*' in the template */
        CTcTokenEle *src, *tele;
        int rem, trem;
        for (src = head, tele = tpl->head, rem = cnt, trem = tpl->cnt ;
             src != 0 && tele != 0 ;
             src = src->getnxt(), tele = tele->getnxt(), --rem, --trem)
        {
            /* stop when we reach '*' in the template */
            if (tele->text_matches("*", 1))
                break;
        }

        /* skip the '*' in the template */
        trem -= 1;

        /* 
         *   The number of tokens matching '*' is the number left in our
         *   list, minus the number left in the token list after the '*'.
         */
        rem -= trem;
        cnt = rem;

        /* if we had any leading fixed tokens to remove, remove them */
        if (src != head)
        {
            CTcTokenEle *dst;
            for (dst = head ; rem != 0 && src != 0 ;
                 src = src->getnxt(), dst = dst->getnxt(), --rem)
            {
                /* copy this token */
                G_tok->copytok(dst, src);
            }
        }

        /* move the write pointer to the proper position */
        for (wrt = head, rem = cnt ; rem != 0 ; wrt = wrt->getnxt(), --rem) ;
    }